

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

ssize_t __thiscall uS::Socket::write(Socket *this,int __fd,void *__buf,size_t __n)

{
  SocketData *socketData;
  Message *pMVar1;
  undefined1 uVar2;
  int iVar3;
  undefined7 uVar6;
  ssize_t sVar4;
  int *piVar5;
  size_t sVar7;
  Queue *pQVar8;
  undefined4 in_register_00000034;
  Message *pMVar9;
  
  pMVar9 = (Message *)CONCAT44(in_register_00000034,__fd);
  socketData = (SocketData *)this->p->data;
  if ((socketData->messageQueue).head == (Message *)0x0) {
    if ((SSL *)socketData->ssl == (SSL *)0x0) {
      sVar4 = send((this->p->io_watcher).fd,pMVar9->data,pMVar9->length,0x4000);
      sVar7 = pMVar9->length - sVar4;
      if (sVar7 == 0) goto LAB_00114531;
      if (sVar4 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 0xb) {
          return 0;
        }
      }
      else {
        pMVar9->length = sVar7;
        pMVar9->data = pMVar9->data + sVar4;
      }
LAB_0011454e:
      if ((socketData->poll & 2U) == 0) {
        socketData->poll = socketData->poll | 2;
        changePoll(this,socketData);
      }
    }
    else {
      iVar3 = SSL_write((SSL *)socketData->ssl,pMVar9->data,(int)pMVar9->length);
      if (pMVar9->length == (long)iVar3) {
LAB_00114531:
        uVar2 = 0;
        uVar6 = 0;
        goto LAB_001144c5;
      }
      if ((iVar3 < 0) && (iVar3 = SSL_get_error((SSL *)socketData->ssl,iVar3), iVar3 != 2)) {
        if (iVar3 != 3) {
          return 0;
        }
        goto LAB_0011454e;
      }
    }
  }
  pMVar9->nextMessage = (Message *)0x0;
  pMVar1 = (socketData->messageQueue).tail;
  pQVar8 = (Queue *)&pMVar1->nextMessage;
  if (pMVar1 == (Message *)0x0) {
    pQVar8 = &socketData->messageQueue;
  }
  pQVar8->head = pMVar9;
  (socketData->messageQueue).tail = pMVar9;
  uVar6 = (undefined7)((ulong)&socketData->messageQueue >> 8);
  uVar2 = 1;
LAB_001144c5:
  *(undefined1 *)__buf = uVar2;
  return CONCAT71(uVar6,1);
}

Assistant:

bool write(SocketData::Queue::Message *message, bool &wasTransferred) {
        ssize_t sent = 0;
        SocketData *socketData = getSocketData();
        if (socketData->messageQueue.empty()) {

            if (socketData->ssl) {
                sent = SSL_write(socketData->ssl, message->data, message->length);
                if (sent == (ssize_t) message->length) {
                    wasTransferred = false;
                    return true;
                } else if (sent < 0) {
                    switch (SSL_get_error(socketData->ssl, sent)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            changePoll(socketData);
                        }
                        break;
                    default:
                        return false;
                    }
                }
            } else {
                sent = ::send(getFd(), message->data, message->length, MSG_NOSIGNAL);
                if (sent == (ssize_t) message->length) {
                    wasTransferred = false;
                    return true;
                } else if (sent == SOCKET_ERROR) {
                    if (errno != EWOULDBLOCK) {
                        return false;
                    }
                } else {
                    message->length -= sent;
                    message->data += sent;
                }

                if ((socketData->poll & UV_WRITABLE) == 0) {
                    socketData->poll |= UV_WRITABLE;
                    changePoll(socketData);
                }
            }
        }
        socketData->messageQueue.push(message);
        wasTransferred = true;
        return true;
    }